

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

void signal_cb(uv_signal_t *handle,int signum)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uv_loop_t *puVar5;
  long lVar6;
  uv_handle_t *puVar7;
  timer_ctx *ptVar8;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_7a8 [144];
  undefined1 auStack_718 [136];
  undefined1 auStack_690 [136];
  undefined1 auStack_608 [136];
  signal_ctx sStack_580;
  uv_loop_t *puStack_4f0;
  void *pvStack_4a0;
  undefined1 auStack_498 [144];
  signal_ctx sStack_408;
  uv_loop_t *puStack_380;
  timer_ctx *ptStack_378;
  ulong uStack_370;
  ulong uStack_368;
  signal_ctx sStack_360;
  signal_ctx sStack_2d8;
  signal_ctx sStack_250;
  signal_ctx sStack_1c8;
  timer_ctx tStack_140;
  timer_ctx tStack_b8;
  
  if (signum == *(int *)&handle[1].data) {
    uVar3 = handle[-1].dispatched_signals + 1;
    handle[-1].dispatched_signals = uVar3;
    if (uVar3 != 10) {
      return;
    }
    if (handle[-1].caught_signals == 0) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
    if (handle[-1].caught_signals == 1) {
      uv_signal_stop(handle);
      return;
    }
  }
  else {
    signal_cb_cold_1();
  }
  signal_cb_cold_2();
  ptStack_378 = (timer_ctx *)0x1b9d03;
  puVar5 = uv_default_loop();
  ptStack_378 = (timer_ctx *)0x1b9d1d;
  start_watcher(puVar5,10,&sStack_360,0);
  ptStack_378 = (timer_ctx *)0x1b9d38;
  start_watcher(puVar5,10,&sStack_2d8,0);
  ptStack_378 = (timer_ctx *)0x1b9d4f;
  start_watcher(puVar5,0xc,&sStack_250,0);
  ptStack_378 = (timer_ctx *)0x1b9d66;
  start_watcher(puVar5,0xc,&sStack_1c8,0);
  ptStack_378 = (timer_ctx *)0x1b9d7e;
  start_timer(puVar5,10,&tStack_140);
  ptStack_378 = (timer_ctx *)0x1b9d91;
  start_timer(puVar5,0xc,&tStack_b8);
  ptStack_378 = (timer_ctx *)0x1b9d9b;
  iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
  uStack_368 = (ulong)iVar4;
  uStack_370 = 0;
  if (uStack_368 != 0) goto LAB_001b9e80;
  lVar6 = 4;
  do {
    uStack_368 = (ulong)*(uint *)((long)&sStack_360.stop_or_close + lVar6);
    uStack_370 = 10;
    if (uStack_368 != 10) {
      ptStack_378 = (timer_ctx *)0x1b9e73;
      run_test_we_get_signals_cold_2();
      goto LAB_001b9e73;
    }
    lVar6 = lVar6 + 0x88;
  } while (lVar6 != 0x224);
  ptVar8 = &tStack_140;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uStack_368 = (ulong)ptVar8->ncalls;
    uStack_370 = 10;
    if (uStack_368 != 10) goto LAB_001b9e73;
    ptVar8 = &tStack_b8;
    bVar1 = false;
  } while (bVar2);
  ptStack_378 = (timer_ctx *)0x1b9e26;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  ptStack_378 = (timer_ctx *)0x1b9e30;
  uv_run(puVar5,UV_RUN_DEFAULT);
  uStack_368 = 0;
  ptStack_378 = (timer_ctx *)0x1b9e41;
  iVar4 = uv_loop_close(puVar5);
  uStack_370 = (ulong)iVar4;
  if (uStack_368 == uStack_370) {
    ptStack_378 = (timer_ctx *)0x1b9e57;
    uv_library_shutdown();
    return;
  }
LAB_001b9e8d:
  ptStack_378 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_380 = puVar5;
  ptStack_378 = &tStack_b8;
  puVar5 = uv_default_loop();
  start_timer(puVar5,0x11,(timer_ctx *)(auStack_498 + 8));
  start_watcher(puVar5,0x11,&sStack_408,1);
  sStack_408.stop_or_close = NOOP;
  iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
  auStack_498._0_8_ = SEXT48(iVar4);
  pvStack_4a0 = (void *)0x0;
  if ((void *)auStack_498._0_8_ == (void *)0x0) {
    auStack_498._0_8_ = ZEXT48((uint)auStack_498._8_4_);
    pvStack_4a0 = (void *)0xa;
    if ((void *)auStack_498._0_8_ != (void *)0xa) goto LAB_001ba0b7;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba0c6;
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_498 + 8));
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_498._0_8_ = SEXT48(iVar4);
    pvStack_4a0 = (void *)0x0;
    if ((void *)auStack_498._0_8_ != (void *)0x0) goto LAB_001ba0d5;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba0e4;
    sStack_408.stop_or_close = CLOSE;
    sStack_408.ncalls = 0;
    uv_signal_start_oneshot(&sStack_408.handle,signal_cb_one_shot,0x11);
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_498 + 8));
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_498._0_8_ = SEXT48(iVar4);
    pvStack_4a0 = (void *)0x0;
    if ((void *)auStack_498._0_8_ != (void *)0x0) goto LAB_001ba0f3;
    auStack_498._0_8_ = ZEXT48((uint)auStack_498._8_4_);
    pvStack_4a0 = (void *)0xa;
    if ((void *)auStack_498._0_8_ != (void *)0xa) goto LAB_001ba102;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba111;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_498._0_8_ = (void *)0x0;
    iVar4 = uv_loop_close(puVar5);
    pvStack_4a0 = (void *)(long)iVar4;
    if ((void *)auStack_498._0_8_ == pvStack_4a0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba0b7:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba0c6:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0d5:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0e4:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0f3:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba102:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba111:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar7 = (uv_handle_t *)auStack_498;
  uVar3 = (uint)&pvStack_4a0;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar3 == puVar7[1].flags) {
    iVar4 = *(int *)&puVar7[-1].field_0x3c + 1;
    *(int *)&puVar7[-1].field_0x3c = iVar4;
    if (iVar4 == 1) {
      if (puVar7[-1].flags == 0) {
        uv_close(puVar7,(uv_close_cb)0x0);
        return;
      }
      return;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_4f0 = puVar5;
  puVar5 = uv_default_loop();
  start_timer(puVar5,0x11,(timer_ctx *)(auStack_7a8 + 8));
  start_watcher(puVar5,0x11,(signal_ctx *)auStack_718,1);
  start_watcher(puVar5,0x11,(signal_ctx *)auStack_690,1);
  auStack_718._0_4_ = CLOSE;
  auStack_690._0_4_ = CLOSE;
  iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
  auStack_7a8._0_8_ = SEXT48(iVar4);
  if ((void *)auStack_7a8._0_8_ == (void *)0x0) {
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba84f;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_718._4_4_ != 1) goto LAB_001ba85e;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba86d;
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_718,1);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_690,1);
    auStack_718._0_4_ = CLOSE;
    auStack_690._0_4_ = CLOSE;
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_608,0);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar4);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba87c;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba88b;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_718._4_4_ != 1) goto LAB_001ba89a;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba8a9;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba8b8;
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_690,0);
    auStack_718._0_4_ = CLOSE;
    auStack_690._0_4_ = CLOSE;
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_608,1);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar4);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba8c7;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8d6;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8e5;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_690._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8f4;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba903;
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_690,0);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_608,1);
    start_watcher(puVar5,0x11,&sStack_580,1);
    auStack_608._0_4_ = CLOSE;
    sStack_580.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_718 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_690 + 8),(uv_close_cb)0x0);
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar4);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba912;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba921;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba930;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_690._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba93f;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_608._4_4_ != 1) goto LAB_001ba94e;
    auStack_7a8._0_8_ = (void *)0x1;
    start_timer(puVar5,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_690,1);
    start_watcher(puVar5,0x11,(signal_ctx *)auStack_608,0);
    start_watcher(puVar5,0x11,&sStack_580,0);
    sStack_580.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_718 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar4 = uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar4);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba96c;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba97b;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba98a;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba999;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba9a8;
    auStack_7a8._0_8_ = ZEXT48(sStack_580.ncalls);
    if ((void *)auStack_7a8._0_8_ == (void *)0xa) {
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      auStack_7a8._0_8_ = (void *)0x0;
      iVar4 = uv_loop_close(puVar5);
      if ((void *)auStack_7a8._0_8_ == (void *)(long)iVar4) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001ba9c6;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba84f:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba85e:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba86d:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba87c:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba88b:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba89a:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba8a9:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba8b8:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba8c7:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8d6:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8e5:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8f4:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba903:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba912:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba921:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba930:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba93f:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba94e:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba96c:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba97b:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba98a:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba999:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba9a8:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba9c6:
  puVar7 = (uv_handle_t *)auStack_7a8;
  run_test_we_get_signals_mixed_cold_27();
  iVar4 = uv_is_closing(puVar7);
  if (iVar4 == 0) {
    uv_close(puVar7,(uv_close_cb)0x0);
    return;
  }
  return;
LAB_001b9e73:
  ptStack_378 = (timer_ctx *)0x1b9e80;
  run_test_we_get_signals_cold_3();
LAB_001b9e80:
  ptStack_378 = (timer_ctx *)0x1b9e8d;
  run_test_we_get_signals_cold_1();
  goto LAB_001b9e8d;
}

Assistant:

static void signal_cb(uv_signal_t* handle, int signum) {
  struct signal_ctx* ctx = container_of(handle, struct signal_ctx, handle);
  ASSERT_EQ(signum, ctx->signum);
  if (++ctx->ncalls == NSIGNALS) {
    if (ctx->stop_or_close == STOP)
      uv_signal_stop(handle);
    else if (ctx->stop_or_close == CLOSE)
      uv_close((uv_handle_t*)handle, NULL);
    else
      ASSERT(0);
  }
}